

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

uint __thiscall Compiler::evaluateBracket(Compiler *this,string *originalLine)

{
  Parser *pPVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  pointer pbVar5;
  int iVar6;
  Scope *pSVar7;
  ulong uVar8;
  Instruction op;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __tmp;
  string *psVar13;
  string *psVar14;
  bool bVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  anon_class_8_1_8991fb9c addVariableToStack;
  string peiceBuffer;
  string line;
  allocator_type local_151;
  ulong local_150;
  undefined1 local_148 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  Parser *local_108;
  InstructionGenerator *local_100;
  anon_class_8_1_8991fb9c local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  string *local_98;
  Compiler *local_90;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pPVar1 = &this->parser;
  pcVar3 = (originalLine->_M_dataplus)._M_p;
  local_f8.this = this;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + originalLine->_M_string_length);
  Parser::extractBracketArguments(&local_f0,pPVar1,&local_68);
  local_108 = pPVar1;
  psVar14 = local_f0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar13 = local_f0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
    psVar14 = local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar13 = local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pbVar5 = local_f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      bVar15 = psVar14 !=
               local_f0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      local_f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar13, bVar15; psVar14 = psVar14 + 1) {
    while (*(psVar14->_M_dataplus)._M_p == ' ') {
      std::__cxx11::string::erase((ulong)psVar14,0);
    }
    std::__cxx11::string::replace((ulong)psVar14,0,(char *)0x0,0x110367);
    while ((psVar14->_M_dataplus)._M_p[psVar14->_M_string_length - 1] == ' ') {
      std::__cxx11::string::erase((ulong)psVar14,psVar14->_M_string_length - 1);
    }
    std::__cxx11::string::append((char *)psVar14);
    psVar13 = local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_f0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  if (psVar13 !=
      local_f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_100 = &this->igen;
    local_90 = this;
    do {
      pPVar1 = local_108;
      Parser::bracketOperatorFix(&local_88,local_108,psVar13 + -1);
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98 = psVar13 + -1;
      Parser::extractBracket(pPVar1,&local_88,&local_128);
      if (local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar8 = 0;
        local_150 = 0;
        do {
          iVar11 = (int)uVar8;
          psVar14 = local_128.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar8;
          pSVar7 = getPastScope(this,psVar14);
          if (pSVar7 == (Scope *)0x0) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8._M_string_length = 0;
            local_d8.field_2._M_local_buf[0] = '\0';
            local_148._16_8_ = (pointer)0x0;
            local_148._0_8_ = (pointer)0x0;
            local_148._8_8_ = (pointer)0x0;
            if (psVar14->_M_string_length != 0) {
              bVar15 = false;
              uVar8 = 0;
              uVar10 = 1;
              do {
                cVar2 = (psVar14->_M_dataplus)._M_p[uVar8];
                bVar15 = (bool)(cVar2 == '\"' ^ bVar15);
                if ((cVar2 != ' ') || (bVar15)) {
                  std::__cxx11::string::push_back((char)&local_d8);
                }
                else {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_148,&local_d8);
                  local_d8._M_string_length = 0;
                  *local_d8._M_dataplus._M_p = '\0';
                }
                bVar4 = uVar10 < psVar14->_M_string_length;
                uVar8 = uVar10;
                uVar10 = (ulong)((int)uVar10 + 1);
              } while (bVar4);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_148,&local_d8);
            uVar12 = (uint)local_150;
            psVar14 = (string *)(local_148._8_8_ + -0x20);
            iVar6 = std::__cxx11::string::compare((char *)psVar14);
            if (iVar6 == 0) {
              op = MATH_ADD;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)psVar14);
              if (iVar6 == 0) {
                op = MATH_SUBTRACT;
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)psVar14);
                if (iVar6 == 0) {
                  op = MATH_MULTIPLY;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)psVar14);
                  if (iVar6 == 0) {
                    op = MATH_DIVIDE;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)psVar14);
                    if (iVar6 == 0) {
                      op = MATH_MOD;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)psVar14);
                      if (iVar6 == 0) {
                        op = CONCENTRATE_STRINGS;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)psVar14);
                        if (iVar6 == 0) {
                          op = COMPARE_EQUAL;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)psVar14);
                          if (iVar6 == 0) {
                            op = COMPARE_UNEQUAL;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)psVar14);
                            if (iVar6 == 0) {
                              op = COMPARE_LESS_THAN;
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)psVar14);
                              if (iVar6 == 0) {
                                op = COMPARE_MORE_THAN;
                              }
                              else {
                                iVar6 = std::__cxx11::string::compare((char *)psVar14);
                                if (iVar6 == 0) {
                                  op = COMPARE_LESS_THAN_OR_EQUAL;
                                }
                                else {
                                  iVar6 = std::__cxx11::string::compare((char *)psVar14);
                                  if (iVar6 == 0) {
                                    op = COMPARE_MORE_THAN_OR_EQUAL;
                                  }
                                  else {
                                    iVar6 = std::__cxx11::string::compare((char *)psVar14);
                                    if (iVar6 == 0) {
                                      op = COMPARE_AND;
                                    }
                                    else {
                                      iVar6 = std::__cxx11::string::compare((char *)psVar14);
                                      op = -(uint)(iVar6 != 0) | COMPARE_OR;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            if (local_148._8_8_ - local_148._0_8_ == 0x20) {
              lVar9 = 1;
              bVar15 = true;
            }
            else {
              uVar8 = 0;
              uVar10 = 1;
              do {
                evaluateBracket::anon_class_8_1_8991fb9c::operator()
                          (&local_f8,(string *)(local_148._0_8_ + uVar8 * 0x20));
                lVar9 = (long)(local_148._8_8_ - local_148._0_8_) >> 5;
                bVar15 = uVar10 < lVar9 - 1U;
                uVar8 = uVar10;
                uVar10 = (ulong)((int)uVar10 + 1);
              } while (bVar15);
              bVar15 = local_148._8_8_ - local_148._0_8_ == 0x20;
              uVar12 = (uint)local_150;
            }
            if (op == NONE) {
              if (bVar15) {
                evaluateBracket::anon_class_8_1_8991fb9c::operator()(&local_f8,psVar14);
                uVar12 = uVar12 + 1;
              }
              uVar12 = (uVar12 + (int)((ulong)(local_148._8_8_ - local_148._0_8_) >> 5)) - 1;
            }
            else {
              if (bVar15) {
                InstructionGenerator::genOperator(local_100,op,uVar12);
                uVar12 = 0;
              }
              else {
                InstructionGenerator::genOperator(local_100,op,(int)lVar9 - 1);
              }
              uVar12 = uVar12 + 1;
            }
            local_150 = (ulong)uVar12;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_148);
            this = local_90;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
          }
          else {
            local_148._0_8_ = local_148 + 0x10;
            local_148._8_8_ = (pointer)0x0;
            local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
            if (pSVar7->argumentCount != 0) {
              iVar11 = iVar11 + 1;
              std::__cxx11::string::_M_assign((string *)local_148);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            pcVar3 = (psVar14->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar3,pcVar3 + psVar14->_M_string_length);
            local_b8[0] = local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b8,local_148._0_8_,
                       (undefined1 *)
                       ((long)&((_Alloc_hider *)local_148._8_8_)->_M_p +
                       (long)&((_Alloc_hider *)local_148._0_8_)->_M_p));
            __l._M_len = 2;
            __l._M_array = &local_d8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_48,__l,&local_151);
            processFunction(this,&local_48,false);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            lVar9 = 0;
            do {
              if (local_a8 + lVar9 != *(undefined1 **)((long)local_b8 + lVar9)) {
                operator_delete(*(undefined1 **)((long)local_b8 + lVar9));
              }
              lVar9 = lVar9 + -0x20;
            } while (lVar9 != -0x40);
            if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_);
            }
            local_150 = (ulong)((int)local_150 + 1);
            iVar11 = iVar11 + 1;
          }
          uVar8 = (ulong)(iVar11 + 1);
        } while (uVar8 < (ulong)((long)local_128.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_128.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      psVar13 = local_98;
    } while (local_98 !=
             local_f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  return 0;
}

Assistant:

unsigned int Compiler::evaluateBracket(std::string originalLine)
{
    unsigned int variablesOnStack = 0;
    variablesOnStack = 0;
    auto addVariableToStack = [&] (const std::string &data) -> void
    {
        if(igen.isVariable(data) != -1) //If it's a variable
        {
            igen.genCloneTop(data);
        }
        else //Else if it's raw data
        {
            if(data[0] == '"') //If string
            {
                igen.genCreateString("", data.substr(1, data.size()-2));
            }
            else if(data[0] == '\'') //If character
            {
                igen.genCreateChar("", data[1]);
            }
            else if(data == "true") //If boolean
            {
                igen.genCreateBool("", true);
            }
            else if(data == "false") //If boolean
            {
                igen.genCreateBool("", false);
            }
            else //Else if number
            {
                igen.genCreateInt("", stoull(data));
            }
        }
    };

    auto handleSubSegment = [&] (const std::vector<std::string> &segments) -> void
    {
        //Get operator of bracket if any
        const std::string &segmentOperator = segments.back();
        //Check to see if it's a variable, if so, float to top of stack
        Instruction segmentInstruction = stringToInstruction(segmentOperator);
        for(unsigned int a = 0; a < segments.size()-1; a++)
        {
            addVariableToStack(segments[a]);
        }
        //If it's an instruction
        if(segmentInstruction != Instruction::NONE)
        {
            if(segments.size() == 1)
            {
                igen.genOperator(segmentInstruction, variablesOnStack);
                variablesOnStack = 0;
            }
            else
            {
                igen.genOperator(segmentInstruction, segments.size() - 1);
            }
            variablesOnStack++;
        }
        else //Else if its a piece of data
        {
            if(segments.size() == 1)
            {
                addVariableToStack(segmentOperator);
                variablesOnStack++;
            }
            variablesOnStack += segments.size()-1;
        }
    };

    //Split the arguments
    std::vector<std::string> &&arguments = parser.extractBracketArguments(originalLine);

    //Bracket all arguments, removing unneeded spaces
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0, 1);
        arg.insert(0, "(");
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
        arg += ")";
    }

    //Parse each argument separately
    for(auto iter = arguments.rbegin(); iter != arguments.rend(); iter++)
    {
        variablesOnStack = 0;
        const std::string &lineToParse = *iter;
        std::string line = parser.bracketOperatorFix(lineToParse);
        std::vector<std::string> components;
        parser.extractBracket(line, components);

        //Split segments by space
        for(unsigned int a = 0; a < components.size(); a++)
        {
            const std::string &segment = components[a];

            //If it's a function, call it
            Scope *possibleFunction = getPastScope(segment);
            if(possibleFunction != nullptr) //It's a function
            {
                //Take arguments from next segment only if the function accepts arguments
                std::string arg;
                if(possibleFunction->argumentCount > 0)
                    arg = components[++a];

                //Call it with the provided arguments if any, not destroying the return value
                processFunction({segment, arg}, false);
                variablesOnStack++;
                a++;
            }
            else //It's not a function
            {
                //Split by space
                std::string peiceBuffer;
                std::vector<std::string> subSegment;
                bool isQuoteOpen = false;
                for(unsigned int c = 0; c < segment.size(); c++)
                {
                    if(segment[c] == '"')
                        isQuoteOpen = !isQuoteOpen;
                    if(segment[c] == ' ' && isQuoteOpen == false)
                    {
                        subSegment.emplace_back(peiceBuffer);
                        peiceBuffer.clear();
                    }
                    else
                    {
                        peiceBuffer += segment[c];
                    }
                }
                subSegment.emplace_back(peiceBuffer);
                handleSubSegment(subSegment);
            }
        }
    }
    return 0;
}